

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator::GenerateSerializationCode
          (RepeatedImmutableEnumFieldGenerator *this,Printer *printer)

{
  Printer *this_00;
  bool bVar1;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  RepeatedImmutableEnumFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar1 = FieldDescriptor::is_packed((this->super_ImmutableEnumFieldGenerator).descriptor_);
  this_00 = local_18;
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,
               "if (get$capitalized_name$List().size() > 0) {\n  output.writeUInt32NoTag($tag$);\n  output.writeUInt32NoTag($name$MemoizedSerializedSize);\n}\nfor (int i = 0; i < $name$_.size(); i++) {\n  output.writeEnumNoTag($name$_.getInt(i));\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (this_00,&(this->super_ImmutableEnumFieldGenerator).variables_,local_28);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,
               "for (int i = 0; i < $name$_.size(); i++) {\n  output.writeEnum($number$, $name$_.getInt(i));\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (this_00,&(this->super_ImmutableEnumFieldGenerator).variables_,local_38);
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldGenerator::GenerateSerializationCode(
    io::Printer* printer) const {
  if (descriptor_->is_packed()) {
    printer->Print(variables_,
                   "if (get$capitalized_name$List().size() > 0) {\n"
                   "  output.writeUInt32NoTag($tag$);\n"
                   "  output.writeUInt32NoTag($name$MemoizedSerializedSize);\n"
                   "}\n"
                   "for (int i = 0; i < $name$_.size(); i++) {\n"
                   "  output.writeEnumNoTag($name$_.getInt(i));\n"
                   "}\n");
  } else {
    printer->Print(variables_,
                   "for (int i = 0; i < $name$_.size(); i++) {\n"
                   "  output.writeEnum($number$, $name$_.getInt(i));\n"
                   "}\n");
  }
}